

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O3

TestStatus * __thiscall
vkt::shaderexecutor::
BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_2,_2>,_tcu::Matrix<float,_2,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_2,_2>,_vkt::shaderexecutor::Void>_>
::iterate(TestStatus *__return_storage_ptr__,
         BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_2,_2>,_tcu::Matrix<float,_2,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_2,_2>,_vkt::shaderexecutor::Void>_>
         *this)

{
  TestLog *pTVar1;
  ostringstream *poVar2;
  ostream *poVar3;
  Precision PVar4;
  Samplings<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_2,_2>,_tcu::Matrix<float,_2,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  *this_00;
  size_t sVar5;
  Statement *pSVar6;
  ShaderExecutor *pSVar7;
  Variable<tcu::Matrix<float,_2,_2>_> *pVVar8;
  pointer pcVar9;
  byte bVar10;
  BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_2,_2>,_tcu::Matrix<float,_2,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_2,_2>,_vkt::shaderexecutor::Void>_>
  *pBVar11;
  double dVar12;
  pointer pMVar13;
  bool bVar14;
  int iVar15;
  uint uVar16;
  float afVar17 [2];
  IVal *pIVar18;
  long lVar19;
  long *plVar20;
  Matrix<float,_2,_2> *pMVar21;
  float afVar22 [2];
  IVal *ival;
  float afVar23 [2];
  byte bVar24;
  FloatFormat *pFVar25;
  TestStatus *pTVar26;
  IVal in2;
  IVal reference1;
  FuncSet funcs;
  IVal in3;
  Environment env;
  IVal in0;
  Outputs<vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_2,_2>,_vkt::shaderexecutor::Void>_>
  outputs;
  FloatFormat highpFmt;
  void *outputArr [2];
  Inputs<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_2,_2>,_tcu::Matrix<float,_2,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  inputs;
  void *inputArr [4];
  ResultCollector status;
  ostringstream oss;
  deUint32 in_stack_fffffffffffffa78;
  undefined1 local_580 [8];
  float local_578;
  float fStack_574;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_570;
  BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_2,_2>,_tcu::Matrix<float,_2,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_2,_2>,_vkt::shaderexecutor::Void>_>
  *local_560;
  IVal local_551;
  IVal *local_550;
  size_t local_548;
  undefined1 local_540 [16];
  undefined1 local_530 [24];
  double local_518;
  double local_4e0;
  double local_4d8;
  TestStatus *local_4d0;
  FloatFormat *local_4c8;
  string local_4c0;
  double local_4a0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  local_498;
  undefined1 local_468 [16];
  undefined1 local_458 [56];
  double local_420;
  double dStack_418;
  double local_410;
  ios_base local_3f8 [8];
  ios_base local_3f0 [264];
  Outputs<vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_2,_2>,_vkt::shaderexecutor::Void>_>
  local_2e8;
  FloatFormat local_2b8;
  pointer local_288;
  pointer local_280;
  Inputs<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_2,_2>,_tcu::Matrix<float,_2,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  local_278;
  pointer local_218;
  pointer local_210;
  pointer local_208;
  pointer local_200;
  ResultCollector local_1f8;
  undefined1 local_1a8 [48];
  undefined1 local_178 [32];
  double dStack_158;
  double local_150;
  ios_base local_138 [264];
  
  this_00 = this->m_samplings;
  pFVar25 = &(this->m_caseCtx).floatFormat;
  PVar4 = (this->m_caseCtx).precision;
  sVar5 = (this->m_caseCtx).numRandoms;
  local_4d0 = __return_storage_ptr__;
  iVar15 = tcu::CommandLine::getBaseSeed(((this->m_caseCtx).testContext)->m_cmdLine);
  local_4c8 = pFVar25;
  generateInputs<vkt::shaderexecutor::InTypes<tcu::Matrix<float,2,2>,tcu::Matrix<float,2,2>,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void>>
            (&local_278,(shaderexecutor *)this_00,
             (Samplings<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_2,_2>,_tcu::Matrix<float,_2,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
              *)pFVar25,(FloatFormat *)(ulong)PVar4,(Precision)sVar5,(ulong)(iVar15 + 0xdeadbeef),
             in_stack_fffffffffffffa78);
  pMVar13 = local_278.in0.
            super__Vector_base<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_548 = (long)local_278.in0.
                    super__Vector_base<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_278.in0.
                    super__Vector_base<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 4;
  Outputs<vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_2,_2>,_vkt::shaderexecutor::Void>_>::
  Outputs(&local_2e8,local_548);
  local_2b8.m_maxValue = (this->m_caseCtx).highpFormat.m_maxValue;
  local_2b8.m_minExp = (this->m_caseCtx).highpFormat.m_minExp;
  local_2b8.m_maxExp = (this->m_caseCtx).highpFormat.m_maxExp;
  local_2b8.m_fractionBits = (this->m_caseCtx).highpFormat.m_fractionBits;
  local_2b8.m_hasSubnormal = (this->m_caseCtx).highpFormat.m_hasSubnormal;
  local_2b8.m_hasInf = (this->m_caseCtx).highpFormat.m_hasInf;
  local_2b8.m_hasNaN = (this->m_caseCtx).highpFormat.m_hasNaN;
  local_2b8.m_exactPrecision = (this->m_caseCtx).highpFormat.m_exactPrecision;
  local_2b8._25_7_ = *(undefined7 *)&(this->m_caseCtx).highpFormat.field_0x19;
  local_498._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_498._M_impl.super__Rb_tree_header._M_header;
  local_498._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_498._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_498._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_498._M_impl.super__Rb_tree_header._M_header._M_right =
       local_498._M_impl.super__Rb_tree_header._M_header._M_left;
  tcu::ResultCollector::ResultCollector(&local_1f8);
  local_550 = (IVal *)((this->super_TestInstance).m_context)->m_testCtx->m_log;
  local_218 = local_278.in0.
              super__Vector_base<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_210 = local_278.in1.
              super__Vector_base<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_208 = local_278.in2.
              super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_200 = local_278.in3.
              super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_288 = local_2e8.out0.
              super__Vector_base<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_280 = local_2e8.out1.
              super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
              ._M_impl.super__Vector_impl_data._M_start;
  poVar2 = (ostringstream *)(local_468 + 8);
  local_560 = this;
  local_468._0_8_ = local_550;
  std::__cxx11::ostringstream::ostringstream(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"Statement: ",0xb);
  std::ostream::_M_insert<bool>(SUB81(poVar2,0));
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_468,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar2);
  std::ios_base::~ios_base(local_3f0);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  afVar22 = (float  [2])((long)local_540 + 8);
  local_540._8_4_ = _S_red;
  local_530._0_4_ = 0.0;
  local_530._4_4_ = 0.0;
  local_518 = 0.0;
  pSVar6 = (local_560->m_stmt).super_SharedPtr<const_vkt::shaderexecutor::Statement>.m_ptr;
  local_530._8_8_ = afVar22;
  local_530._16_8_ = afVar22;
  (*pSVar6->_vptr_Statement[4])(pSVar6,local_540);
  if ((float  [2])local_530._8_8_ != afVar22) {
    afVar17 = (float  [2])local_530._8_8_;
    do {
      (**(code **)(**(long **)((long)afVar17 + 0x20) + 0x30))
                (*(long **)((long)afVar17 + 0x20),local_1a8);
      afVar17 = (float  [2])std::_Rb_tree_increment((_Rb_tree_node_base *)afVar17);
    } while (afVar17 != afVar22);
  }
  if (local_518 != 0.0) {
    poVar2 = (ostringstream *)(local_468 + 8);
    local_468._0_8_ = local_550;
    std::__cxx11::ostringstream::ostringstream(poVar2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar2,"Reference definitions:\n",0x17);
    std::__cxx11::stringbuf::str();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar2,(char *)CONCAT44(local_580._4_4_,local_580._0_4_),
               CONCAT44(fStack_574,local_578));
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_468,(EndMessageToken *)&tcu::TestLog::EndMessage);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_580._4_4_,local_580._0_4_) != &local_570) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT44(local_580._4_4_,local_580._0_4_),
                      local_570._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream(poVar2);
    std::ios_base::~ios_base(local_3f0);
  }
  std::
  _Rb_tree<const_vkt::shaderexecutor::FuncBase_*,_const_vkt::shaderexecutor::FuncBase_*,_std::_Identity<const_vkt::shaderexecutor::FuncBase_*>,_std::less<const_vkt::shaderexecutor::FuncBase_*>,_std::allocator<const_vkt::shaderexecutor::FuncBase_*>_>
  ::~_Rb_tree((_Rb_tree<const_vkt::shaderexecutor::FuncBase_*,_const_vkt::shaderexecutor::FuncBase_*,_std::_Identity<const_vkt::shaderexecutor::FuncBase_*>,_std::less<const_vkt::shaderexecutor::FuncBase_*>,_std::allocator<const_vkt::shaderexecutor::FuncBase_*>_>
               *)local_540);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  pBVar11 = local_560;
  pSVar7 = (local_560->m_executor).
           super_UniqueBase<vkt::shaderexecutor::ShaderExecutor,_de::DefaultDeleter<vkt::shaderexecutor::ShaderExecutor>_>
           .m_data.ptr;
  (*pSVar7->_vptr_ShaderExecutor[2])(pSVar7,local_548,&local_218,&local_288,0);
  tcu::Matrix<tcu::Interval,_2,_2>::Matrix((Matrix<tcu::Interval,_2,_2> *)local_468);
  tcu::Matrix<tcu::Interval,_2,_2>::Matrix((Matrix<tcu::Interval,_2,_2> *)local_1a8);
  tcu::Matrix<tcu::Interval,_2,_2>::Matrix((Matrix<tcu::Interval,_2,_2> *)local_540);
  Environment::bind<tcu::Matrix<float,2,2>>
            ((Environment *)&local_498,
             (pBVar11->m_variables).in0.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_2,_2>_>_>.m_ptr,
             (IVal *)local_468);
  Environment::bind<tcu::Matrix<float,2,2>>
            ((Environment *)&local_498,
             (pBVar11->m_variables).in1.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_2,_2>_>_>.m_ptr,
             (IVal *)local_1a8);
  Environment::bind<vkt::shaderexecutor::Void>
            ((Environment *)&local_498,
             (pBVar11->m_variables).in2.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr,
             (IVal *)local_580);
  Environment::bind<vkt::shaderexecutor::Void>
            ((Environment *)&local_498,
             (pBVar11->m_variables).in3.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr,
             (IVal *)&local_4c0);
  Environment::bind<tcu::Matrix<float,2,2>>
            ((Environment *)&local_498,
             (pBVar11->m_variables).out0.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_2,_2>_>_>.m_ptr,
             (IVal *)local_540);
  Environment::bind<vkt::shaderexecutor::Void>
            ((Environment *)&local_498,
             (pBVar11->m_variables).out1.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr,
             &local_551);
  if (local_278.in0.
      super__Vector_base<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>.
      _M_impl.super__Vector_impl_data._M_finish == pMVar13) {
LAB_008fb906:
    poVar2 = (ostringstream *)(local_468 + 8);
    local_468._0_8_ = local_550;
    std::__cxx11::ostringstream::ostringstream(poVar2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"All ",4);
    pTVar26 = local_4d0;
    std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2," inputs passed.",0xf);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_468,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar2);
    std::ios_base::~ios_base(local_3f0);
    local_468._0_8_ = (IVal *)local_458;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_468,"Pass","");
    pTVar26->m_code = QP_TEST_RESULT_PASS;
    (pTVar26->m_description)._M_dataplus._M_p = (pointer)&(pTVar26->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&pTVar26->m_description,local_468._0_8_,
               (pointer)(local_468._0_8_ + CONCAT44(local_468._12_4_,local_468._8_4_)));
    if ((IVal *)local_468._0_8_ == (IVal *)local_458) goto LAB_008fbae5;
    afVar22[1] = (float)local_458._4_4_;
    afVar22[0] = (float)local_458._0_4_;
    pIVar18 = (IVal *)local_468._0_8_;
  }
  else {
    local_4a0 = (double)(local_548 + (local_548 == 0));
    local_4d8 = 0.0;
    local_4e0 = 0.0;
    pFVar25 = local_4c8;
    do {
      tcu::Matrix<tcu::Interval,_2,_2>::Matrix((Matrix<tcu::Interval,_2,_2> *)local_1a8);
      dVar12 = local_4d8;
      local_580._0_4_ =
           local_278.in0.
           super__Vector_base<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>.
           _M_impl.super__Vector_impl_data._M_start[(long)local_4d8].m_data.m_data[0].m_data[0];
      local_578 = local_278.in0.
                  super__Vector_base<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[(long)local_4d8].m_data.m_data[1].m_data
                  [0];
      local_580._4_4_ =
           local_278.in0.
           super__Vector_base<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>.
           _M_impl.super__Vector_impl_data._M_start[(long)local_4d8].m_data.m_data[0].m_data[1];
      fStack_574 = local_278.in0.
                   super__Vector_base<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[(long)local_4d8].m_data.m_data[1].
                   m_data[1];
      ContainerTraits<tcu::Matrix<float,_2,_2>,_tcu::Matrix<tcu::Interval,_2,_2>_>::doRound
                ((IVal *)local_540,pFVar25,(Matrix<float,_2,_2> *)local_580);
      ContainerTraits<tcu::Matrix<float,_2,_2>,_tcu::Matrix<tcu::Interval,_2,_2>_>::doConvert
                ((IVal *)local_468,pFVar25,(IVal *)local_540);
      pIVar18 = Environment::lookup<tcu::Matrix<float,2,2>>
                          ((Environment *)&local_498,
                           (local_560->m_variables).in0.
                           super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_2,_2>_>_>
                           .m_ptr);
      (pIVar18->m_data).m_data[0].m_data[0].m_hi = (double)CONCAT44(local_458._4_4_,local_458._0_4_)
      ;
      *(undefined8 *)(pIVar18->m_data).m_data[0].m_data = local_468._0_8_;
      (pIVar18->m_data).m_data[0].m_data[0].m_lo =
           (double)CONCAT44(local_468._12_4_,local_468._8_4_);
      (pIVar18->m_data).m_data[1].m_data[0].m_hi = (double)local_458._48_8_;
      *(undefined8 *)(pIVar18->m_data).m_data[1].m_data = local_458._32_8_;
      (pIVar18->m_data).m_data[1].m_data[0].m_lo =
           (double)CONCAT44(local_458._44_4_,local_458._40_4_);
      (pIVar18->m_data).m_data[0].m_data[1].m_hi =
           (double)CONCAT44(local_458._28_4_,local_458._24_4_);
      *(ulong *)((pIVar18->m_data).m_data[0].m_data + 1) =
           CONCAT44(local_458._12_4_,local_458._8_4_);
      (pIVar18->m_data).m_data[0].m_data[1].m_lo = (double)local_458._16_8_;
      (pIVar18->m_data).m_data[1].m_data[1].m_hi = local_410;
      *(double *)((pIVar18->m_data).m_data[1].m_data + 1) = local_420;
      (pIVar18->m_data).m_data[1].m_data[1].m_lo = dStack_418;
      local_580._0_4_ =
           local_278.in1.
           super__Vector_base<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>.
           _M_impl.super__Vector_impl_data._M_start[(long)dVar12].m_data.m_data[0].m_data[0];
      local_578 = local_278.in1.
                  super__Vector_base<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[(long)dVar12].m_data.m_data[1].m_data[0]
      ;
      local_580._4_4_ =
           local_278.in1.
           super__Vector_base<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>.
           _M_impl.super__Vector_impl_data._M_start[(long)dVar12].m_data.m_data[0].m_data[1];
      fStack_574 = local_278.in1.
                   super__Vector_base<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[(long)dVar12].m_data.m_data[1].m_data
                   [1];
      ContainerTraits<tcu::Matrix<float,_2,_2>,_tcu::Matrix<tcu::Interval,_2,_2>_>::doRound
                ((IVal *)local_540,pFVar25,(Matrix<float,_2,_2> *)local_580);
      ContainerTraits<tcu::Matrix<float,_2,_2>,_tcu::Matrix<tcu::Interval,_2,_2>_>::doConvert
                ((IVal *)local_468,pFVar25,(IVal *)local_540);
      pBVar11 = local_560;
      pIVar18 = Environment::lookup<tcu::Matrix<float,2,2>>
                          ((Environment *)&local_498,
                           (local_560->m_variables).in1.
                           super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_2,_2>_>_>
                           .m_ptr);
      (pIVar18->m_data).m_data[0].m_data[0].m_hi = (double)CONCAT44(local_458._4_4_,local_458._0_4_)
      ;
      *(undefined8 *)(pIVar18->m_data).m_data[0].m_data = local_468._0_8_;
      (pIVar18->m_data).m_data[0].m_data[0].m_lo =
           (double)CONCAT44(local_468._12_4_,local_468._8_4_);
      (pIVar18->m_data).m_data[1].m_data[0].m_hi = (double)local_458._48_8_;
      *(undefined8 *)(pIVar18->m_data).m_data[1].m_data = local_458._32_8_;
      (pIVar18->m_data).m_data[1].m_data[0].m_lo =
           (double)CONCAT44(local_458._44_4_,local_458._40_4_);
      *(ulong *)((pIVar18->m_data).m_data[0].m_data + 1) =
           CONCAT44(local_458._12_4_,local_458._8_4_);
      (pIVar18->m_data).m_data[0].m_data[1].m_lo = (double)local_458._16_8_;
      (pIVar18->m_data).m_data[0].m_data[1].m_hi =
           (double)CONCAT44(local_458._28_4_,local_458._24_4_);
      *(double *)((pIVar18->m_data).m_data[1].m_data + 1) = local_420;
      (pIVar18->m_data).m_data[1].m_data[1].m_lo = dStack_418;
      (pIVar18->m_data).m_data[1].m_data[1].m_hi = local_410;
      Environment::lookup<vkt::shaderexecutor::Void>
                ((Environment *)&local_498,
                 (pBVar11->m_variables).in2.
                 super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.
                 m_ptr);
      Environment::lookup<vkt::shaderexecutor::Void>
                ((Environment *)&local_498,
                 (pBVar11->m_variables).in3.
                 super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.
                 m_ptr);
      local_458._24_4_ = (pBVar11->m_caseCtx).precision;
      local_458._16_8_ = pFVar25->m_maxValue;
      local_468._0_8_ = *(undefined8 *)pFVar25;
      local_468._8_4_ = pFVar25->m_fractionBits;
      local_468._12_4_ = pFVar25->m_hasSubnormal;
      local_458._0_4_ = pFVar25->m_hasInf;
      local_458._4_4_ = pFVar25->m_hasNaN;
      local_458[8] = pFVar25->m_exactPrecision;
      local_458._9_3_ = *(undefined3 *)&pFVar25->field_0x19;
      local_458._12_4_ = *(undefined4 *)&pFVar25->field_0x1c;
      local_458._40_4_ = 0;
      pSVar6 = (pBVar11->m_stmt).super_SharedPtr<const_vkt::shaderexecutor::Statement>.m_ptr;
      local_458._32_8_ = &local_498;
      (*pSVar6->_vptr_Statement[3])(pSVar6,(string *)local_468);
      pIVar18 = Environment::lookup<tcu::Matrix<float,2,2>>
                          ((Environment *)&local_498,
                           (pBVar11->m_variables).out0.
                           super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_2,_2>_>_>
                           .m_ptr);
      ContainerTraits<tcu::Matrix<float,_2,_2>,_tcu::Matrix<tcu::Interval,_2,_2>_>::doConvert
                ((IVal *)local_468,&local_2b8,pIVar18);
      pMVar13 = local_2e8.out0.
                super__Vector_base<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      local_1a8._16_8_ = CONCAT44(local_458._4_4_,local_458._0_4_);
      local_1a8._8_8_ = CONCAT44(local_468._12_4_,local_468._8_4_);
      local_1a8._0_8_ = local_468._0_8_;
      local_178._16_8_ = local_458._48_8_;
      local_178._8_8_ = CONCAT44(local_458._44_4_,local_458._40_4_);
      local_178._0_8_ = local_458._32_8_;
      local_1a8._40_8_ = CONCAT44(local_458._28_4_,local_458._24_4_);
      local_1a8._24_8_ = CONCAT44(local_458._12_4_,local_458._8_4_);
      local_1a8._32_8_ = local_458._16_8_;
      local_150 = local_410;
      local_178._24_8_ = local_420;
      dStack_158 = dStack_418;
      bVar24 = 1;
      lVar19 = 0;
      ival = (IVal *)local_1a8;
      do {
        bVar14 = contains<tcu::Vector<float,2>>(ival,pMVar13[(long)dVar12].m_data.m_data + lVar19);
        lVar19 = 1;
        bVar10 = bVar24 & bVar14;
        bVar24 = 0;
        ival = (IVal *)local_178;
      } while (bVar10 != 0);
      local_468._0_8_ = (IVal *)local_458;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_468,"Shader output 0 is outside acceptable range","");
      bVar14 = tcu::ResultCollector::check(&local_1f8,bVar14,(string *)local_468);
      pFVar25 = local_4c8;
      if ((IVal *)local_468._0_8_ != (IVal *)local_458) {
        operator_delete((void *)local_468._0_8_,CONCAT44(local_458._4_4_,local_458._0_4_) + 1);
      }
      if ((!bVar14) &&
         (uVar16 = SUB84(local_4e0,0) + 1, local_4e0 = (double)(ulong)uVar16, (int)uVar16 < 0x65)) {
        local_468._0_8_ = local_550;
        poVar2 = (ostringstream *)(local_468 + 8);
        std::__cxx11::ostringstream::ostringstream(poVar2);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"Failed",6);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2," sample:\n",9);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"\t",1);
        pVVar8 = (local_560->m_variables).in0.
                 super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_2,_2>_>_>.
                 m_ptr;
        pMVar21 = (Matrix<float,_2,_2> *)local_530;
        pcVar9 = (pVVar8->m_name)._M_dataplus._M_p;
        local_540._0_8_ = pMVar21;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_540,pcVar9,pcVar9 + (pVVar8->m_name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_468 + 8),(char *)local_540._0_8_,
                   CONCAT44(local_540._12_4_,local_540._8_4_));
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_468 + 8)," = ",3);
        valueToString<tcu::Matrix<float,2,2>>
                  ((string *)local_580,(shaderexecutor *)&local_2b8,
                   (FloatFormat *)
                   (local_278.in0.
                    super__Vector_base<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + (long)dVar12),pMVar21);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_468 + 8),(char *)CONCAT44(local_580._4_4_,local_580._0_4_),
                   CONCAT44(fStack_574,local_578));
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_468 + 8),"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(local_580._4_4_,local_580._0_4_) != &local_570) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT44(local_580._4_4_,local_580._0_4_),
                          local_570._M_allocated_capacity + 1);
        }
        if ((Matrix<float,_2,_2> *)local_540._0_8_ != (Matrix<float,_2,_2> *)local_530) {
          operator_delete((void *)local_540._0_8_,(ulong)(local_530._0_8_ + 1));
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_468 + 8),"\t",1);
        pVVar8 = (local_560->m_variables).in1.
                 super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_2,_2>_>_>.
                 m_ptr;
        pMVar21 = (Matrix<float,_2,_2> *)local_530;
        pcVar9 = (pVVar8->m_name)._M_dataplus._M_p;
        local_540._0_8_ = pMVar21;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_540,pcVar9,pcVar9 + (pVVar8->m_name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_468 + 8),(char *)local_540._0_8_,
                   CONCAT44(local_540._12_4_,local_540._8_4_));
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_468 + 8)," = ",3);
        valueToString<tcu::Matrix<float,2,2>>
                  ((string *)local_580,(shaderexecutor *)&local_2b8,
                   (FloatFormat *)
                   (local_278.in1.
                    super__Vector_base<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + (long)dVar12),pMVar21);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_468 + 8),(char *)CONCAT44(local_580._4_4_,local_580._0_4_),
                   CONCAT44(fStack_574,local_578));
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_468 + 8),"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(local_580._4_4_,local_580._0_4_) != &local_570) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT44(local_580._4_4_,local_580._0_4_),
                          local_570._M_allocated_capacity + 1);
        }
        if ((Matrix<float,_2,_2> *)local_540._0_8_ != (Matrix<float,_2,_2> *)local_530) {
          operator_delete((void *)local_540._0_8_,(ulong)(local_530._0_8_ + 1));
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_468 + 8),"\t",1);
        pVVar8 = (local_560->m_variables).out0.
                 super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_2,_2>_>_>.
                 m_ptr;
        pIVar18 = (IVal *)local_530;
        pcVar9 = (pVVar8->m_name)._M_dataplus._M_p;
        local_540._0_8_ = pIVar18;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_540,pcVar9,pcVar9 + (pVVar8->m_name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_468 + 8),(char *)local_540._0_8_,
                   CONCAT44(local_540._12_4_,local_540._8_4_));
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_468 + 8)," = ",3);
        valueToString<tcu::Matrix<float,2,2>>
                  ((string *)local_580,(shaderexecutor *)&local_2b8,
                   (FloatFormat *)
                   (local_2e8.out0.
                    super__Vector_base<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + (long)dVar12),
                   (Matrix<float,_2,_2> *)pIVar18);
        poVar3 = (ostream *)(local_468 + 8);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar3,(char *)CONCAT44(local_580._4_4_,local_580._0_4_),
                   CONCAT44(fStack_574,local_578));
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\tExpected range: ",0x11);
        intervalToString<tcu::Matrix<float,2,2>>
                  (&local_4c0,(shaderexecutor *)&local_2b8,(FloatFormat *)local_1a8,pIVar18);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar3,local_4c0._M_dataplus._M_p,local_4c0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4c0._M_dataplus._M_p != &local_4c0.field_2) {
          operator_delete(local_4c0._M_dataplus._M_p,local_4c0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(local_580._4_4_,local_580._0_4_) != &local_570) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT44(local_580._4_4_,local_580._0_4_),
                          local_570._M_allocated_capacity + 1);
        }
        if ((IVal *)local_540._0_8_ != (IVal *)local_530) {
          operator_delete((void *)local_540._0_8_,(ulong)(local_530._0_8_ + 1));
        }
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_468,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_468 + 8));
        std::ios_base::~ios_base(local_3f0);
      }
      local_4d8 = (double)((long)local_4d8 + 1);
    } while (local_4d8 != local_4a0);
    iVar15 = SUB84(local_4e0,0);
    if (iVar15 < 0x65) {
      if (iVar15 == 0) goto LAB_008fb906;
    }
    else {
      poVar2 = (ostringstream *)(local_468 + 8);
      local_468._0_8_ = local_550;
      std::__cxx11::ostringstream::ostringstream(poVar2);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"(Skipped ",9);
      std::ostream::operator<<(poVar2,iVar15 + -100);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2," messages.)",0xb);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_468,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar2);
      std::ios_base::~ios_base(local_3f0);
    }
    poVar2 = (ostringstream *)(local_468 + 8);
    local_468._0_8_ = local_550;
    std::__cxx11::ostringstream::ostringstream(poVar2);
    std::ostream::operator<<(poVar2,iVar15);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"/",1);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2," inputs failed.",0xf);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_468,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar2);
    std::ios_base::~ios_base(local_3f0);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_468);
    std::ostream::operator<<(local_468,iVar15);
    pTVar26 = local_4d0;
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_468);
    std::ios_base::~ios_base(local_3f8);
    local_468._0_8_ = (IVal *)local_458;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_468," test failed. Check log for the details","");
    afVar22 = (float  [2])
              (CONCAT44(local_468._12_4_,local_468._8_4_) +
              CONCAT44(local_540._12_4_,local_540._8_4_));
    afVar17[0] = 2.10195e-44;
    afVar17[1] = 0.0;
    if ((IVal *)local_540._0_8_ != (IVal *)local_530) {
      afVar17 = (float  [2])local_530._0_8_;
    }
    if ((ulong)afVar17 < (ulong)afVar22) {
      afVar23[0] = 2.10195e-44;
      afVar23[1] = 0.0;
      if ((IVal *)local_468._0_8_ != (IVal *)local_458) {
        afVar23[1] = (float)local_458._4_4_;
        afVar23[0] = (float)local_458._0_4_;
      }
      if ((ulong)afVar23 < (ulong)afVar22) goto LAB_008fb8f7;
      plVar20 = (long *)std::__cxx11::string::replace
                                  ((ulong)local_468,0,(char *)0x0,local_540._0_8_);
    }
    else {
LAB_008fb8f7:
      plVar20 = (long *)std::__cxx11::string::_M_append(local_540,local_468._0_8_);
    }
    local_1a8._0_8_ = local_1a8 + 0x10;
    pTVar1 = (TestLog *)(plVar20 + 2);
    if ((TestLog *)*plVar20 == pTVar1) {
      local_1a8._16_8_ = pTVar1->m_log;
      local_1a8._24_8_ = plVar20[3];
    }
    else {
      local_1a8._16_8_ = pTVar1->m_log;
      local_1a8._0_8_ = (TestLog *)*plVar20;
    }
    local_1a8._8_8_ = plVar20[1];
    *plVar20 = (long)pTVar1;
    plVar20[1] = 0;
    *(undefined1 *)&pTVar1->m_log = 0;
    pTVar26->m_code = QP_TEST_RESULT_FAIL;
    (pTVar26->m_description)._M_dataplus._M_p = (pointer)&(pTVar26->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&pTVar26->m_description,local_1a8._0_8_,
               (undefined1 *)((long)(qpTestLog **)local_1a8._0_8_ + local_1a8._8_8_));
    if ((TestLog *)local_1a8._0_8_ != (TestLog *)(local_1a8 + 0x10)) {
      operator_delete((void *)local_1a8._0_8_,(ulong)((long)(deUint32 *)local_1a8._16_8_ + 1));
    }
    if ((IVal *)local_468._0_8_ != (IVal *)local_458) {
      operator_delete((void *)local_468._0_8_,CONCAT44(local_458._4_4_,local_458._0_4_) + 1);
    }
    afVar22 = (float  [2])local_530._0_8_;
    pIVar18 = (IVal *)local_540._0_8_;
    if ((IVal *)local_540._0_8_ == (IVal *)local_530) goto LAB_008fbae5;
  }
  operator_delete(pIVar18,(ulong)((long)afVar22 + 1));
LAB_008fbae5:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8.m_message._M_dataplus._M_p != &local_1f8.m_message.field_2) {
    operator_delete(local_1f8.m_message._M_dataplus._M_p,
                    local_1f8.m_message.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8.m_prefix._M_dataplus._M_p != &local_1f8.m_prefix.field_2) {
    operator_delete(local_1f8.m_prefix._M_dataplus._M_p,
                    local_1f8.m_prefix.field_2._M_allocated_capacity + 1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  ::~_Rb_tree(&local_498);
  if (local_2e8.out1.
      super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2e8.out1.
                    super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_2e8.out1.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2e8.out1.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_2e8.out0.
      super__Vector_base<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2e8.out0.
                    super__Vector_base<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_2e8.out0.
                          super__Vector_base<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2e8.out0.
                          super__Vector_base<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_278.in3.
      super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_278.in3.
                    super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_278.in3.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_278.in3.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_278.in2.
      super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_278.in2.
                    super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_278.in2.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_278.in2.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_278.in1.
      super__Vector_base<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_278.in1.
                    super__Vector_base<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_278.in1.
                          super__Vector_base<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_278.in1.
                          super__Vector_base<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_278.in0.
      super__Vector_base<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_278.in0.
                    super__Vector_base<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_278.in0.
                          super__Vector_base<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_278.in0.
                          super__Vector_base<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return pTVar26;
}

Assistant:

tcu::TestStatus BuiltinPrecisionCaseTestInstance<In, Out>::iterate (void)
{
	typedef typename	In::In0		In0;
	typedef typename	In::In1		In1;
	typedef typename	In::In2		In2;
	typedef typename	In::In3		In3;
	typedef typename	Out::Out0	Out0;
	typedef typename	Out::Out1	Out1;

	Inputs<In>			inputs		= generateInputs(m_samplings, m_caseCtx.floatFormat, m_caseCtx.precision, m_caseCtx.numRandoms, 0xdeadbeefu + m_caseCtx.testContext.getCommandLine().getBaseSeed());
	const FloatFormat&	fmt			= m_caseCtx.floatFormat;
	const int			inCount		= numInputs<In>();
	const int			outCount	= numOutputs<Out>();
	const size_t		numValues	= (inCount > 0) ? inputs.in0.size() : 1;
	Outputs<Out>		outputs		(numValues);
	const FloatFormat	highpFmt	= m_caseCtx.highpFormat;
	const int			maxMsgs		= 100;
	int					numErrors	= 0;
	Environment			env;		// Hoisted out of the inner loop for optimization.
	ResultCollector		status;
	TestLog&			testLog		= m_context.getTestContext().getLog();

	const void*			inputArr[]	=
	{
		&inputs.in0.front(), &inputs.in1.front(), &inputs.in2.front(), &inputs.in3.front(),
	};
	void*				outputArr[]	=
	{
		&outputs.out0.front(), &outputs.out1.front(),
	};

	// Print out the statement and its definitions
	testLog << TestLog::Message << "Statement: " << m_stmt << TestLog::EndMessage;
	{
		ostringstream	oss;
		FuncSet			funcs;

		m_stmt->getUsedFuncs(funcs);
		for (FuncSet::const_iterator it = funcs.begin(); it != funcs.end(); ++it)
		{
			(*it)->printDefinition(oss);
		}
		if (!funcs.empty())
			testLog << TestLog::Message << "Reference definitions:\n" << oss.str()
				  << TestLog::EndMessage;
	}

	switch (inCount)
	{
		case 4: DE_ASSERT(inputs.in3.size() == numValues);
		case 3: DE_ASSERT(inputs.in2.size() == numValues);
		case 2: DE_ASSERT(inputs.in1.size() == numValues);
		case 1: DE_ASSERT(inputs.in0.size() == numValues);
		default: break;
	}

	m_executor->execute(int(numValues), inputArr, outputArr);

	// Initialize environment with dummy values so we don't need to bind in inner loop.
	{
		const typename Traits<In0>::IVal		in0;
		const typename Traits<In1>::IVal		in1;
		const typename Traits<In2>::IVal		in2;
		const typename Traits<In3>::IVal		in3;
		const typename Traits<Out0>::IVal		reference0;
		const typename Traits<Out1>::IVal		reference1;

		env.bind(*m_variables.in0, in0);
		env.bind(*m_variables.in1, in1);
		env.bind(*m_variables.in2, in2);
		env.bind(*m_variables.in3, in3);
		env.bind(*m_variables.out0, reference0);
		env.bind(*m_variables.out1, reference1);
	}

	// For each input tuple, compute output reference interval and compare
	// shader output to the reference.
	for (size_t valueNdx = 0; valueNdx < numValues; valueNdx++)
	{
		bool						result		= true;
		typename Traits<Out0>::IVal	reference0;
		typename Traits<Out1>::IVal	reference1;

		env.lookup(*m_variables.in0) = convert<In0>(fmt, round(fmt, inputs.in0[valueNdx]));
		env.lookup(*m_variables.in1) = convert<In1>(fmt, round(fmt, inputs.in1[valueNdx]));
		env.lookup(*m_variables.in2) = convert<In2>(fmt, round(fmt, inputs.in2[valueNdx]));
		env.lookup(*m_variables.in3) = convert<In3>(fmt, round(fmt, inputs.in3[valueNdx]));

		{
			EvalContext	ctx (fmt, m_caseCtx.precision, env);
			m_stmt->execute(ctx);
		}

		switch (outCount)
		{
			case 2:
				reference1 = convert<Out1>(highpFmt, env.lookup(*m_variables.out1));
				if (!status.check(contains(reference1, outputs.out1[valueNdx]),
									"Shader output 1 is outside acceptable range"))
					result = false;
			case 1:
				reference0 = convert<Out0>(highpFmt, env.lookup(*m_variables.out0));
				if (!status.check(contains(reference0, outputs.out0[valueNdx]),
									"Shader output 0 is outside acceptable range"))
					result = false;
			default: break;
		}

		if (!result)
			++numErrors;

		if ((!result && numErrors <= maxMsgs) || GLS_LOG_ALL_RESULTS)
		{
			MessageBuilder	builder	= testLog.message();

			builder << (result ? "Passed" : "Failed") << " sample:\n";

			if (inCount > 0)
			{
				builder << "\t" << m_variables.in0->getName() << " = "
						<< valueToString(highpFmt, inputs.in0[valueNdx]) << "\n";
			}

			if (inCount > 1)
			{
				builder << "\t" << m_variables.in1->getName() << " = "
						<< valueToString(highpFmt, inputs.in1[valueNdx]) << "\n";
			}

			if (inCount > 2)
			{
				builder << "\t" << m_variables.in2->getName() << " = "
						<< valueToString(highpFmt, inputs.in2[valueNdx]) << "\n";
			}

			if (inCount > 3)
			{
				builder << "\t" << m_variables.in3->getName() << " = "
						<< valueToString(highpFmt, inputs.in3[valueNdx]) << "\n";
			}

			if (outCount > 0)
			{
				builder << "\t" << m_variables.out0->getName() << " = "
						<< valueToString(highpFmt, outputs.out0[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out0>(highpFmt, reference0) << "\n";
			}

			if (outCount > 1)
			{
				builder << "\t" << m_variables.out1->getName() << " = "
						<< valueToString(highpFmt, outputs.out1[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out1>(highpFmt, reference1) << "\n";
			}

			builder << TestLog::EndMessage;
		}
	}

	if (numErrors > maxMsgs)
	{
		testLog << TestLog::Message << "(Skipped " << (numErrors - maxMsgs) << " messages.)"
			  << TestLog::EndMessage;
	}

	if (numErrors == 0)
	{
		testLog << TestLog::Message << "All " << numValues << " inputs passed."
			  << TestLog::EndMessage;
	}
	else
	{
		testLog << TestLog::Message << numErrors << "/" << numValues << " inputs failed."
			  << TestLog::EndMessage;
	}

	if (numErrors)
		return tcu::TestStatus::fail(de::toString(numErrors) + string(" test failed. Check log for the details"));
	else
		return tcu::TestStatus::pass("Pass");

}